

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::remove_from_select
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,select_case_t *select_case)

{
  select_case_t *psVar1;
  select_case_t *psVar2;
  select_case_t *psVar3;
  
  std::mutex::lock(&this->m_lock);
  psVar2 = this->m_select_tail;
  psVar1 = (select_case_t *)0x0;
  do {
    psVar3 = psVar1;
    psVar1 = psVar2;
    if (psVar1 == (select_case_t *)0x0) goto LAB_002542f5;
    psVar2 = *(select_case_t **)(psVar1 + 0x18);
  } while (psVar1 != select_case);
  psVar2 = psVar3 + 0x18;
  if (psVar3 == (select_case_t *)0x0) {
    psVar2 = (select_case_t *)&this->m_select_tail;
  }
  *(select_case_t **)psVar2 = *(select_case_t **)(psVar1 + 0x18);
LAB_002542f5:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void
		remove_from_select(
			select_case_t & select_case ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				select_case_t * c = m_select_tail;
				select_case_t * prev = nullptr;
				while( c )
					{
						select_case_t * const next = c->query_next();
						if( c == &select_case )
							{
								if( prev )
									prev->set_next( next );
								else
									m_select_tail = next;

								return;
							}

						prev = c;
						c = next;
					}
			}